

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_core_module.c
# Opt level: O0

ngx_int_t ngx_stream_core_content_phase(ngx_stream_session_t *s,ngx_stream_phase_handler_t *ph)

{
  ngx_connection_t *c_00;
  undefined8 *puVar1;
  int iVar2;
  int *piVar3;
  ngx_stream_core_srv_conf_t *cscf;
  ngx_connection_t *c;
  ngx_stream_phase_handler_t *pnStack_20;
  int tcp_nodelay;
  ngx_stream_phase_handler_t *ph_local;
  ngx_stream_session_t *s_local;
  
  c_00 = s->connection;
  c_00->log->action = (char *)0x0;
  puVar1 = (undefined8 *)s->srv_conf[ngx_stream_core_module.ctx_index];
  pnStack_20 = ph;
  ph_local = (ngx_stream_phase_handler_t *)s;
  if (((c_00->type == 1) && (puVar1[4] != 0)) && ((*(uint *)&c_00->field_0xd8 >> 0x14 & 3) == 0)) {
    if ((c_00->log->log_level & 0x400) != 0) {
      ngx_log_error_core(8,c_00->log,0,"tcp_nodelay");
    }
    c._4_4_ = 1;
    iVar2 = setsockopt(c_00->fd,6,1,(void *)((long)&c + 4),4);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      ngx_connection_error(c_00,*piVar3,"setsockopt(TCP_NODELAY) failed");
      ngx_stream_finalize_session((ngx_stream_session_t *)ph_local,500);
      return 0;
    }
    *(uint *)&c_00->field_0xd8 = *(uint *)&c_00->field_0xd8 & 0xffcfffff | 0x100000;
  }
  (*(code *)*puVar1)(ph_local);
  return 0;
}

Assistant:

ngx_int_t
ngx_stream_core_content_phase(ngx_stream_session_t *s,
    ngx_stream_phase_handler_t *ph)
{
    int                          tcp_nodelay;
    ngx_connection_t            *c;
    ngx_stream_core_srv_conf_t  *cscf;

    c = s->connection;

    c->log->action = NULL;

    cscf = ngx_stream_get_module_srv_conf(s, ngx_stream_core_module);

    if (c->type == SOCK_STREAM
        && cscf->tcp_nodelay
        && c->tcp_nodelay == NGX_TCP_NODELAY_UNSET)
    {
        ngx_log_debug0(NGX_LOG_DEBUG_STREAM, c->log, 0, "tcp_nodelay");

        tcp_nodelay = 1;

        if (setsockopt(c->fd, IPPROTO_TCP, TCP_NODELAY,
                       (const void *) &tcp_nodelay, sizeof(int)) == -1)
        {
            ngx_connection_error(c, ngx_socket_errno,
                                 "setsockopt(TCP_NODELAY) failed");
            ngx_stream_finalize_session(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
            return NGX_OK;
        }

        c->tcp_nodelay = NGX_TCP_NODELAY_SET;
    }

    cscf->handler(s);

    return NGX_OK;
}